

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

int lest::select(int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
                timeval *__timeout)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  ulong extraout_RAX;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  uint *extraout_RAX_00;
  uint *puVar5;
  ulong uVar6;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  uint uVar7;
  long lVar8;
  byte bVar9;
  undefined4 in_register_0000003c;
  long *plVar10;
  _Alloc_hider _Var11;
  char *pcVar12;
  long *plVar13;
  anon_class_1_0_00000001 hidden;
  anon_class_1_0_00000001 local_139;
  char *local_138;
  long *local_130;
  uint *local_128;
  long local_120;
  uint local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  uint *local_108;
  long local_100;
  uint local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined1 *local_e8;
  long local_e0;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  text local_88;
  text local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  plVar10 = (long *)CONCAT44(in_register_0000003c,__nfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)__readfds);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_68,*plVar10,plVar10[1] + *plVar10);
    bVar2 = select::anon_class_1_0_00000001::operator()(&local_139,&local_68);
    uVar7 = (uint)CONCAT71(extraout_var,bVar2) ^ 1;
    _Var11._M_p = local_68._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) goto LAB_0011b946;
  }
  else {
    local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
    uVar6 = extraout_RAX;
    plVar13 = (long *)__readfds->fds_bits[1];
    local_130 = plVar10;
    do {
      plVar1 = plVar13;
      plVar13 = plVar1 + -4;
      plVar10 = (long *)__readfds->fds_bits[0];
      if (plVar1 == plVar10) {
        uVar7 = (uint)uVar6;
        break;
      }
      iVar3 = std::__cxx11::string::compare((char *)plVar13);
      __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      if (iVar3 == 0) {
        bVar2 = false;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)plVar13);
        if (iVar3 != 0) {
          local_a8 = local_98;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a8,*plVar13,plVar1[-3] + *plVar13);
          local_c8 = local_b8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,*local_130,local_130[1] + *local_130);
          __exceptfds = (fd_set *)(local_a8 + local_a0);
          _Var4 = std::
                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                            (local_c8,local_c8 + local_c0,local_a8,__exceptfds);
          pcVar12 = local_c8 + local_c0;
          if (local_c8 != local_b8) {
            operator_delete(local_c8);
          }
          if (local_a8 != local_98) {
            operator_delete(local_a8);
          }
          if (_Var4._M_current == pcVar12) {
            if (*(char *)*plVar13 == '!') {
              std::__cxx11::string::substr((ulong)&local_128,(ulong)plVar13);
              local_108 = &local_f8;
              if (local_128 == &local_118) {
                uStack_f0 = uStack_110;
                uStack_ec = uStack_10c;
              }
              else {
                local_108 = local_128;
              }
              _local_f8 = CONCAT44(uStack_114,local_118);
              local_100 = local_120;
              local_120 = 0;
              local_118 = local_118 & 0xffffff00;
              local_e8 = local_d8;
              local_128 = &local_118;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e8,*local_130,local_130[1] + *local_130);
              lVar8 = local_100 + (long)local_108;
              local_138 = (char *)std::
                                  __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                                            (local_e8,local_e8 + local_e0,local_108,lVar8);
              pcVar12 = local_e8 + local_e0;
              bVar2 = local_138 == pcVar12;
              if (local_e8 != local_d8) {
                operator_delete(local_e8);
              }
              if (local_108 != &local_f8) {
                operator_delete(local_108);
              }
              puVar5 = &local_118;
              if (local_128 != puVar5) {
                operator_delete(local_128);
                puVar5 = extraout_RAX_00;
              }
              __exceptfds = (fd_set *)
                            CONCAT71((int7)((ulong)lVar8 >> 8),local_138 == pcVar12 & (byte)uVar6);
              local_138 = (char *)CONCAT44(local_138._4_4_,
                                           (int)CONCAT71((int7)((ulong)puVar5 >> 8),1));
            }
            else {
              bVar2 = true;
              local_138 = (char *)((ulong)local_138 & 0xffffffff00000000);
              __exceptfds = (fd_set *)
                            (CONCAT71((int7)((ulong)*plVar13 >> 8),(byte)uVar6) & 0xffffffff);
            }
            goto LAB_0011b881;
          }
        }
        bVar2 = false;
        __exceptfds = (fd_set *)CONCAT71((int7)((ulong)__exceptfds >> 8),1);
      }
LAB_0011b881:
      uVar7 = (uint)__exceptfds;
      uVar6 = (ulong)__exceptfds & 0xffffffff;
    } while (bVar2);
    if (plVar1 != plVar10) goto LAB_0011b946;
    bVar9 = (byte)local_138;
    if (((ulong)local_138 & 1) == 0) {
      uVar7 = 0;
    }
    else {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*local_130,local_130[1] + *local_130);
      bVar2 = select::anon_class_1_0_00000001::operator()(&local_139,&local_88);
      uVar7 = (uint)CONCAT71(extraout_var_00,bVar2) ^ 1;
    }
    _Var11._M_p = local_88._M_dataplus._M_p;
    if ((bVar9 & (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_88._M_dataplus._M_p != &local_88.field_2) == 0) goto LAB_0011b946;
  }
  operator_delete(_Var11._M_p);
LAB_0011b946:
  return uVar7 & 0xffffff01;
}

Assistant:

inline bool select( text name, texts include )
{
    auto none = []( texts args ) { return args.size() == 0; };

#if lest_FEATURE_REGEX_SEARCH
    auto hidden = []( text arg ){ return match( { "\\[\\..*", "\\[hide\\]" }, arg ); };
#else
    auto hidden = []( text arg ){ return match( { "[.", "[hide]" }, arg ); };
#endif

    if ( none( include ) )
    {
        return ! hidden( name );
    }

    bool any = false;
    for ( auto pos = include.rbegin(); pos != include.rend(); ++pos )
    {
        auto & part = *pos;

        if ( part == "@" || part == "*" )
            return true;

        if ( search( part, name ) )
            return true;

        if ( '!' == part[0] )
        {
            any = true;
            if ( search( part.substr(1), name ) )
                return false;
        }
        else
        {
            any = false;
        }
    }
    return any && ! hidden( name );
}